

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t time_excluded(archive_match *a,archive_entry *entry)

{
  wchar_t wVar1;
  time_t tVar2;
  char *pcVar3;
  archive_rb_node *paVar4;
  long lVar5;
  archive_entry *in_RSI;
  long in_RDI;
  long nsec;
  time_t sec;
  void *pathname;
  match_file *f;
  archive_entry *in_stack_ffffffffffffffc8;
  long local_30;
  void *in_stack_ffffffffffffffe0;
  
  if (*(int *)(in_RDI + 0xe8) != 0) {
    wVar1 = archive_entry_ctime_is_set(in_RSI);
    if (wVar1 == L'\0') {
      local_30 = archive_entry_mtime(in_RSI);
    }
    else {
      local_30 = archive_entry_ctime(in_RSI);
    }
    if (local_30 < *(long *)(in_RDI + 0xf0)) {
      return L'\x01';
    }
    if (local_30 == *(long *)(in_RDI + 0xf0)) {
      wVar1 = archive_entry_ctime_is_set(in_RSI);
      if (wVar1 == L'\0') {
        in_stack_ffffffffffffffc8 = (archive_entry *)archive_entry_mtime_nsec(in_RSI);
      }
      else {
        in_stack_ffffffffffffffc8 = (archive_entry *)archive_entry_ctime_nsec(in_RSI);
      }
      if ((long)in_stack_ffffffffffffffc8 < *(long *)(in_RDI + 0xf8)) {
        return L'\x01';
      }
      if ((in_stack_ffffffffffffffc8 == *(archive_entry **)(in_RDI + 0xf8)) &&
         ((*(uint *)(in_RDI + 0xe8) & 0x10) == 0)) {
        return L'\x01';
      }
    }
  }
  if (*(int *)(in_RDI + 0x118) != 0) {
    wVar1 = archive_entry_ctime_is_set(in_RSI);
    if (wVar1 == L'\0') {
      local_30 = archive_entry_mtime(in_RSI);
    }
    else {
      local_30 = archive_entry_ctime(in_RSI);
    }
    if (*(long *)(in_RDI + 0x120) < local_30) {
      return L'\x01';
    }
    if (local_30 == *(long *)(in_RDI + 0x120)) {
      wVar1 = archive_entry_ctime_is_set(in_RSI);
      if (wVar1 == L'\0') {
        in_stack_ffffffffffffffc8 = (archive_entry *)archive_entry_mtime_nsec(in_RSI);
      }
      else {
        in_stack_ffffffffffffffc8 = (archive_entry *)archive_entry_ctime_nsec(in_RSI);
      }
      if (*(long *)(in_RDI + 0x128) < (long)in_stack_ffffffffffffffc8) {
        return L'\x01';
      }
      if ((in_stack_ffffffffffffffc8 == *(archive_entry **)(in_RDI + 0x128)) &&
         ((*(uint *)(in_RDI + 0x118) & 0x10) == 0)) {
        return L'\x01';
      }
    }
  }
  if (*(int *)(in_RDI + 0xd0) != 0) {
    tVar2 = archive_entry_mtime(in_RSI);
    if (tVar2 < *(long *)(in_RDI + 0xd8)) {
      return L'\x01';
    }
    if (tVar2 == *(long *)(in_RDI + 0xd8)) {
      in_stack_ffffffffffffffc8 = (archive_entry *)archive_entry_mtime_nsec(in_RSI);
      if ((long)in_stack_ffffffffffffffc8 < *(long *)(in_RDI + 0xe0)) {
        return L'\x01';
      }
      if ((in_stack_ffffffffffffffc8 == *(archive_entry **)(in_RDI + 0xe0)) &&
         ((*(uint *)(in_RDI + 0xd0) & 0x10) == 0)) {
        return L'\x01';
      }
    }
  }
  if (*(int *)(in_RDI + 0x100) != 0) {
    tVar2 = archive_entry_mtime(in_RSI);
    if (*(long *)(in_RDI + 0x108) < tVar2) {
      return L'\x01';
    }
    in_stack_ffffffffffffffc8 = (archive_entry *)archive_entry_mtime_nsec(in_RSI);
    if (tVar2 == *(long *)(in_RDI + 0x108)) {
      if (*(long *)(in_RDI + 0x110) < (long)in_stack_ffffffffffffffc8) {
        return L'\x01';
      }
      if ((in_stack_ffffffffffffffc8 == *(archive_entry **)(in_RDI + 0x110)) &&
         ((*(uint *)(in_RDI + 0x100) & 0x10) == 0)) {
        return L'\x01';
      }
    }
  }
  if (*(int *)(in_RDI + 0x150) != 0) {
    pcVar3 = archive_entry_pathname(in_stack_ffffffffffffffc8);
    *(archive_rb_tree_ops **)(in_RDI + 0x138) = &rb_ops_mbs;
    if ((pcVar3 != (char *)0x0) &&
       (paVar4 = __archive_rb_tree_find_node((archive_rb_tree *)in_RSI,in_stack_ffffffffffffffe0),
       paVar4 != (archive_rb_node *)0x0)) {
      if ((paVar4[5].rb_info & 0x200) != 0) {
        tVar2 = archive_entry_ctime(in_RSI);
        if (tVar2 < (long)paVar4[6].rb_info) {
          if ((paVar4[5].rb_info & 2) != 0) {
            return L'\x01';
          }
        }
        else if ((long)paVar4[6].rb_info < tVar2) {
          if ((paVar4[5].rb_info & 1) != 0) {
            return L'\x01';
          }
        }
        else {
          lVar5 = archive_entry_ctime_nsec(in_RSI);
          if (lVar5 < (long)paVar4[7].rb_nodes[0]) {
            if ((paVar4[5].rb_info & 2) != 0) {
              return L'\x01';
            }
          }
          else if ((long)paVar4[7].rb_nodes[0] < lVar5) {
            if ((paVar4[5].rb_info & 1) != 0) {
              return L'\x01';
            }
          }
          else if ((paVar4[5].rb_info & 0x10) != 0) {
            return L'\x01';
          }
        }
      }
      if ((paVar4[5].rb_info & 0x100) != 0) {
        tVar2 = archive_entry_mtime(in_RSI);
        if (tVar2 < (long)paVar4[6].rb_nodes[0]) {
          if ((paVar4[5].rb_info & 2) != 0) {
            return L'\x01';
          }
        }
        else if ((long)paVar4[6].rb_nodes[0] < tVar2) {
          if ((paVar4[5].rb_info & 1) != 0) {
            return L'\x01';
          }
        }
        else {
          lVar5 = archive_entry_mtime_nsec(in_RSI);
          if (lVar5 < (long)paVar4[6].rb_nodes[1]) {
            if ((paVar4[5].rb_info & 2) != 0) {
              return L'\x01';
            }
          }
          else if ((long)paVar4[6].rb_nodes[1] < lVar5) {
            if ((paVar4[5].rb_info & 1) != 0) {
              return L'\x01';
            }
          }
          else if ((paVar4[5].rb_info & 0x10) != 0) {
            return L'\x01';
          }
        }
      }
    }
  }
  return L'\0';
}

Assistant:

static int
time_excluded(struct archive_match *a, struct archive_entry *entry)
{
	struct match_file *f;
	const void *pathname;
	time_t sec;
	long nsec;

	/*
	 * If this file/dir is excluded by a time comparison, skip it.
	 */
	if (a->newer_ctime_filter) {
		/* If ctime is not set, use mtime instead. */
		if (archive_entry_ctime_is_set(entry))
			sec = archive_entry_ctime(entry);
		else
			sec = archive_entry_mtime(entry);
		if (sec < a->newer_ctime_sec)
			return (1); /* Too old, skip it. */
		if (sec == a->newer_ctime_sec) {
			if (archive_entry_ctime_is_set(entry))
				nsec = archive_entry_ctime_nsec(entry);
			else
				nsec = archive_entry_mtime_nsec(entry);
			if (nsec < a->newer_ctime_nsec)
				return (1); /* Too old, skip it. */
			if (nsec == a->newer_ctime_nsec &&
			    (a->newer_ctime_filter & ARCHIVE_MATCH_EQUAL)
			      == 0)
				return (1); /* Equal, skip it. */
		}
	}
	if (a->older_ctime_filter) {
		/* If ctime is not set, use mtime instead. */
		if (archive_entry_ctime_is_set(entry))
			sec = archive_entry_ctime(entry);
		else
			sec = archive_entry_mtime(entry);
		if (sec > a->older_ctime_sec)
			return (1); /* Too new, skip it. */
		if (sec == a->older_ctime_sec) {
			if (archive_entry_ctime_is_set(entry))
				nsec = archive_entry_ctime_nsec(entry);
			else
				nsec = archive_entry_mtime_nsec(entry);
			if (nsec > a->older_ctime_nsec)
				return (1); /* Too new, skip it. */
			if (nsec == a->older_ctime_nsec &&
			    (a->older_ctime_filter & ARCHIVE_MATCH_EQUAL)
			      == 0)
				return (1); /* Eeual, skip it. */
		}
	}
	if (a->newer_mtime_filter) {
		sec = archive_entry_mtime(entry);
		if (sec < a->newer_mtime_sec)
			return (1); /* Too old, skip it. */
		if (sec == a->newer_mtime_sec) {
			nsec = archive_entry_mtime_nsec(entry);
			if (nsec < a->newer_mtime_nsec)
				return (1); /* Too old, skip it. */
			if (nsec == a->newer_mtime_nsec &&
			    (a->newer_mtime_filter & ARCHIVE_MATCH_EQUAL)
			       == 0)
				return (1); /* Equal, skip it. */
		}
	}
	if (a->older_mtime_filter) {
		sec = archive_entry_mtime(entry);
		if (sec > a->older_mtime_sec)
			return (1); /* Too new, skip it. */
		nsec = archive_entry_mtime_nsec(entry);
		if (sec == a->older_mtime_sec) {
			if (nsec > a->older_mtime_nsec)
				return (1); /* Too new, skip it. */
			if (nsec == a->older_mtime_nsec &&
			    (a->older_mtime_filter & ARCHIVE_MATCH_EQUAL)
			       == 0)
				return (1); /* Equal, skip it. */
		}
	}

	/* If there is no excluson list, include the file. */
	if (a->exclusion_entry_list.count == 0)
		return (0);

#if defined(_WIN32) && !defined(__CYGWIN__)
	pathname = archive_entry_pathname_w(entry);
	a->exclusion_tree.rbt_ops = &rb_ops_wcs;
#else
	(void)rb_ops_wcs;
	pathname = archive_entry_pathname(entry);
	a->exclusion_tree.rbt_ops = &rb_ops_mbs;
#endif
	if (pathname == NULL)
		return (0);

	f = (struct match_file *)__archive_rb_tree_find_node(
		&(a->exclusion_tree), pathname);
	/* If the file wasn't rejected, include it. */
	if (f == NULL)
		return (0);

	if (f->flag & ARCHIVE_MATCH_CTIME) {
		sec = archive_entry_ctime(entry);
		if (f->ctime_sec > sec) {
			if (f->flag & ARCHIVE_MATCH_OLDER)
				return (1);
		} else if (f->ctime_sec < sec) {
			if (f->flag & ARCHIVE_MATCH_NEWER)
				return (1);
		} else {
			nsec = archive_entry_ctime_nsec(entry);
			if (f->ctime_nsec > nsec) {
				if (f->flag & ARCHIVE_MATCH_OLDER)
					return (1);
			} else if (f->ctime_nsec < nsec) {
				if (f->flag & ARCHIVE_MATCH_NEWER)
					return (1);
			} else if (f->flag & ARCHIVE_MATCH_EQUAL)
				return (1);
		}
	}
	if (f->flag & ARCHIVE_MATCH_MTIME) {
		sec = archive_entry_mtime(entry);
		if (f->mtime_sec > sec) {
			if (f->flag & ARCHIVE_MATCH_OLDER)
				return (1);
		} else if (f->mtime_sec < sec) {
			if (f->flag & ARCHIVE_MATCH_NEWER)
				return (1);
		} else {
			nsec = archive_entry_mtime_nsec(entry);
			if (f->mtime_nsec > nsec) {
				if (f->flag & ARCHIVE_MATCH_OLDER)
					return (1);
			} else if (f->mtime_nsec < nsec) {
				if (f->flag & ARCHIVE_MATCH_NEWER)
					return (1);
			} else if (f->flag & ARCHIVE_MATCH_EQUAL)
				return (1);
		}
	}
	return (0);
}